

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cc
# Opt level: O0

bool __thiscall tchecker::zg::zone_t::operator==(zone_t *this,zone_t *zone)

{
  bool bVar1;
  bool bVar2;
  db_t *dbm1;
  db_t *dbm2;
  bool local_31;
  bool empty2;
  bool empty1;
  zone_t *zone_local;
  zone_t *this_local;
  
  if (this->_dim == zone->_dim) {
    bVar1 = is_empty(this);
    bVar2 = is_empty(zone);
    if ((bVar1) || (bVar2)) {
      local_31 = false;
      if (bVar1) {
        local_31 = bVar2;
      }
      this_local._7_1_ = local_31;
    }
    else {
      dbm1 = dbm_ptr(this);
      dbm2 = dbm_ptr(zone);
      this_local._7_1_ = tchecker::dbm::is_equal(dbm1,dbm2,this->_dim);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool zone_t::operator==(tchecker::zg::zone_t const & zone) const
{
  if (_dim != zone._dim)
    return false;
  bool empty1 = this->is_empty(), empty2 = zone.is_empty();
  if (empty1 || empty2)
    return (empty1 && empty2);
  return tchecker::dbm::is_equal(dbm_ptr(), zone.dbm_ptr(), _dim);
}